

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_long_&,_const_int_&> * __thiscall
Catch::ExprLhs<long_const&>::operator==
          (BinaryExpr<const_long_&,_const_int_&> *__return_storage_ptr__,ExprLhs<long_const&> *this,
          int *rhs)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  StringRef local_40;
  
  plVar2 = *(long **)this;
  lVar3 = *plVar2;
  iVar1 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = lVar3 == iVar1;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021e910;
  __return_storage_ptr__->m_lhs = plVar2;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }